

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int client_switch_proxy(archive_read_filter *self,uint iindex)

{
  archive_switch_callback *paVar1;
  void *pvVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  archive_read *paVar6;
  
  paVar6 = self->archive;
  if ((paVar6->client).cursor == iindex) {
    iVar4 = 0;
  }
  else {
    (paVar6->client).cursor = iindex;
    paVar1 = (paVar6->client).switcher;
    pvVar2 = (paVar6->client).dataset[iindex].data;
    if (paVar1 == (archive_switch_callback *)0x0) {
      pcVar3 = (code *)(paVar6->client).closer;
      iVar4 = 0;
      if (pcVar3 == (code *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = (*pcVar3)(paVar6,self->data);
        paVar6 = self->archive;
      }
      self->data = pvVar2;
      pcVar3 = (code *)(paVar6->client).opener;
      if (pcVar3 != (code *)0x0) {
        iVar4 = (*pcVar3)(paVar6,pvVar2);
      }
    }
    else {
      iVar4 = (*paVar1)(&paVar6->archive,self->data,pvVar2);
      self->data = pvVar2;
      iVar5 = iVar4;
    }
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int
client_switch_proxy(struct archive_read_filter *self, unsigned int iindex)
{
  int r1 = ARCHIVE_OK, r2 = ARCHIVE_OK;
	void *data2 = NULL;

	/* Don't do anything if already in the specified data node */
	if (self->archive->client.cursor == iindex)
		return (ARCHIVE_OK);

	self->archive->client.cursor = iindex;
	data2 = self->archive->client.dataset[self->archive->client.cursor].data;
	if (self->archive->client.switcher != NULL)
	{
		r1 = r2 = (self->archive->client.switcher)
			((struct archive *)self->archive, self->data, data2);
		self->data = data2;
	}
	else
	{
		/* Attempt to call close and open instead */
		if (self->archive->client.closer != NULL)
			r1 = (self->archive->client.closer)
				((struct archive *)self->archive, self->data);
		self->data = data2;
		if (self->archive->client.opener != NULL)
			r2 = (self->archive->client.opener)
				((struct archive *)self->archive, self->data);
	}
	return (r1 < r2) ? r1 : r2;
}